

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

_Bool matching_test_exists(char *test_name,CgreenVector *tests)

{
  _Bool _Var1;
  int iVar2;
  TestItem *test_item;
  int iVar3;
  
  iVar2 = cgreen_vector_size(tests);
  iVar3 = 0;
  if (iVar2 < 1) {
    _Var1 = false;
  }
  else {
    do {
      test_item = (TestItem *)cgreen_vector_get(tests,iVar3);
      _Var1 = test_matches_pattern(test_name,test_item);
      if (_Var1) {
        return _Var1;
      }
      iVar3 = iVar3 + 1;
      iVar2 = cgreen_vector_size(tests);
    } while (iVar3 < iVar2);
  }
  return _Var1;
}

Assistant:

static bool matching_test_exists(const char *test_name, CgreenVector *tests) {
    for (int i = 0; i<cgreen_vector_size(tests); i++)
        if (test_matches_pattern(test_name, get_item_from(tests, i))) {
            return true;
        }
    return false;
}